

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool TestTrimPBox(ON_BrepTrim *trim,ON_TextLog *text_log)

{
  double dVar1;
  bool bVar2;
  char *format;
  double dVar3;
  double dVar4;
  ON_BoundingBox pbox;
  ON_3dPoint local_98;
  ON_3dPoint local_80;
  ON_BoundingBox local_68;
  ON_Interval local_38;
  
  local_68.m_min.x = (trim->m_pbox).m_min.x;
  local_68.m_min.y = (trim->m_pbox).m_min.y;
  local_68.m_min.z = (trim->m_pbox).m_min.z;
  dVar3 = (trim->m_pbox).m_max.x;
  dVar1 = (trim->m_pbox).m_max.y;
  local_68.m_max.z = (trim->m_pbox).m_max.z;
  dVar4 = (ABS(dVar3) + ABS(local_68.m_min.x)) * 1.490116119385e-08;
  local_68.m_max.x = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= dVar4) {
    local_68.m_max.x = dVar4;
  }
  local_68.m_min.x = local_68.m_min.x - local_68.m_max.x;
  local_68.m_max.x = local_68.m_max.x + dVar3;
  dVar3 = ABS(local_68.m_min.y);
  dVar4 = (ABS(dVar1) + dVar3) * 1.490116119385e-08;
  local_68.m_max.y = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= dVar4) {
    local_68.m_max.y = dVar4;
  }
  local_68.m_min.y = local_68.m_min.y - local_68.m_max.y;
  local_68.m_max.y = local_68.m_max.y + dVar1;
  ON_Curve::PointAtStart(&local_98,(ON_Curve *)trim);
  bVar2 = ON_BoundingBox::IsPointIn(&local_68,&local_98,0);
  if (bVar2) {
    ON_Curve::PointAtEnd(&local_80,(ON_Curve *)trim);
    local_98.z = local_80.z;
    local_98.x = local_80.x;
    local_98.y = local_80.y;
    bVar2 = ON_BoundingBox::IsPointIn(&local_68,&local_98,0);
    if (bVar2) {
      local_38.m_t[1] = dVar3;
      (*(trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])(trim);
      dVar3 = ON_Interval::ParameterAt(&local_38,0.5);
      ON_Curve::PointAt(&local_80,(ON_Curve *)trim,dVar3);
      local_98.z = local_80.z;
      local_98.x = local_80.x;
      local_98.y = local_80.y;
      bVar2 = ON_BoundingBox::IsPointIn(&local_68,&local_98,0);
      if (bVar2) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_T[%d].m_pbox does not contain middle of trim.\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "ON_Brep.m_T[%d].m_pbox does not contain end of trim.\n";
    }
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "ON_Brep.m_T[%d].m_pbox does not contain start of trim.\n";
  }
  ON_TextLog::Print(text_log,format,(ulong)(uint)trim->m_trim_index);
  return false;
}

Assistant:

static
bool TestTrimPBox( const ON_BrepTrim& trim, ON_TextLog* text_log )
{
  ON_3dPoint pt;
  double d;
  ON_BoundingBox pbox = trim.m_pbox;

  
  d = ON_SQRT_EPSILON*(fabs(pbox.m_min.x)+fabs(pbox.m_max.x));
  if ( d < ON_ZERO_TOLERANCE )
    d = ON_ZERO_TOLERANCE;
  pbox.m_min.x -= d;
  pbox.m_max.x += d;

  d = ON_SQRT_EPSILON*(fabs(pbox.m_min.y)+fabs(pbox.m_max.y));
  if ( d < ON_ZERO_TOLERANCE )
    d = ON_ZERO_TOLERANCE;
  pbox.m_min.y -= d;
  pbox.m_max.y += d;

  pt = trim.PointAtStart();
  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain start of trim.\n",trim.m_trim_index);
    return false;
  }

  pt = trim.PointAtEnd();

  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain end of trim.\n",trim.m_trim_index);
    return false;
  }

  pt = trim.PointAt(trim.Domain().ParameterAt(0.5));
  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain middle of trim.\n",trim.m_trim_index);
    return false;
  }

  return true;
}